

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
tf::SmallVectorImpl<int>::append<int_const*>(SmallVectorImpl<int> *this,int *in_start,int *in_end)

{
  void *__dest;
  ulong __n;
  
  __n = (long)in_end - (long)in_start;
  __dest = (this->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
  if ((ulong)((long)(this->super_SmallVectorTemplateBase<int,_true>).
                    super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.CapacityX -
             (long)__dest) < __n) {
    SmallVectorBase::grow_pod
              ((SmallVectorBase *)this,
               &(this->super_SmallVectorTemplateBase<int,_true>).
                super_SmallVectorTemplateCommon<int,_void>.FirstEl,
               (long)__dest +
               (__n - (long)(this->super_SmallVectorTemplateBase<int,_true>).
                            super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX)
               & 0xfffffffffffffffc,4);
    __dest = (this->super_SmallVectorTemplateBase<int,_true>).
             super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
  }
  if (in_start != in_end) {
    memcpy(__dest,in_start,__n);
    __dest = (this->super_SmallVectorTemplateBase<int,_true>).
             super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
  }
  (this->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
  super_SmallVectorBase.EndX = (void *)((long)__dest + __n);
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > size_type(this->capacity_ptr()-this->end()))
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->setEnd(this->end() + NumInputs);
  }